

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

int Jf_ManComputeDelay(Jf_Man_t *p,int fEval)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Gia_Obj_t *pGVar3;
  word *pwVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  
  if (fEval != 0) {
    pGVar2 = p->pGia;
    uVar11 = (ulong)(uint)pGVar2->nObjs;
    if ((0 < pGVar2->nObjs) && (pGVar3 = pGVar2->pObjs, pGVar3 != (Gia_Obj_t *)0x0)) {
      lVar8 = 0;
      do {
        uVar9 = (uint)*(undefined8 *)(pGVar3 + lVar8);
        if (((-1 < (int)uVar9) && ((uVar9 & 0x1fffffff) != 0x1fffffff)) &&
           ((uVar9 & 0x1fffffff) ==
            ((uint)((ulong)*(undefined8 *)(pGVar3 + lVar8) >> 0x20) & 0x1fffffff))) {
          Gia_ObjId(pGVar2,pGVar3 + lVar8);
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                        ,0x458,"void Jf_ObjPropagateBuf(Jf_Man_t *, Gia_Obj_t *, int)");
        }
        if ((~uVar9 & 0x1fffffff) != 0 && -1 < (int)uVar9) {
          if ((int)uVar11 <= lVar8) goto LAB_00753554;
          if (0 < pGVar2->pRefs[lVar8]) {
            if ((p->vCuts).nSize <= lVar8) goto LAB_007534f7;
            uVar9 = (p->vCuts).pArray[lVar8];
            pwVar4 = (p->pMem).pPages[(int)uVar9 >> ((byte)(p->pMem).nPageSize & 0x1f)];
            lVar10 = (long)(int)(uVar9 & (p->pMem).uPageMask);
            uVar9 = *(uint *)((long)pwVar4 + lVar10 * 8 + 4);
            if ((uVar9 & 0xf) == 0) {
              iVar6 = 1;
            }
            else {
              uVar11 = 0;
              iVar6 = 0;
              do {
                uVar7 = *(uint *)((long)pwVar4 + uVar11 * 4 + lVar10 * 8 + 8);
                if ((int)uVar7 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                uVar7 = uVar7 >> 1;
                if ((p->vArr).nSize <= (int)uVar7) goto LAB_007534f7;
                iVar1 = (p->vArr).pArray[uVar7];
                if (iVar6 <= iVar1) {
                  iVar6 = iVar1;
                }
                uVar11 = uVar11 + 1;
              } while ((uVar9 & 0xf) != uVar11);
              iVar6 = iVar6 + 1;
            }
            if ((p->vArr).nSize <= lVar8) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            (p->vArr).pArray[lVar8] = iVar6;
          }
        }
        lVar8 = lVar8 + 1;
        uVar11 = (ulong)pGVar2->nObjs;
      } while (lVar8 < (long)uVar11);
    }
  }
  pGVar2 = p->pGia;
  lVar8 = (long)pGVar2->vCos->nSize;
  if (lVar8 < 1) {
    iVar6 = 0;
  }
  else {
    lVar10 = 0;
    iVar6 = 0;
    do {
      iVar1 = pGVar2->vCos->pArray[lVar10];
      if (((long)iVar1 < 0) || (pGVar2->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar5 = pGVar2->pObjs;
      pGVar3 = pGVar5 + iVar1 + -(ulong)((uint)*(undefined8 *)(pGVar5 + iVar1) & 0x1fffffff);
      if ((pGVar3 < pGVar5) || (pGVar5 + pGVar2->nObjs <= pGVar3)) {
LAB_00753554:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar9 = (int)((long)pGVar3 - (long)pGVar5 >> 2) * -0x55555555;
      if (pGVar2->pRefs[(int)uVar9] < 1) {
        __assert_fail("Gia_ObjRefNum(p->pGia, pObj) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                      ,0x517,"int Jf_ManComputeDelay(Jf_Man_t *, int)");
      }
      if (((int)uVar9 < 0) || ((p->vArr).nSize <= (int)uVar9)) {
LAB_007534f7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = (p->vArr).pArray[uVar9 & 0x7fffffff];
      if (iVar6 <= iVar1) {
        iVar6 = iVar1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar8 != lVar10);
  }
  return iVar6;
}

Assistant:

int Jf_ManComputeDelay( Jf_Man_t * p, int fEval )
{
    Gia_Obj_t * pObj; 
    int i, Delay = 0;
    if ( fEval )
    {
        Gia_ManForEachObj( p->pGia, pObj, i )
            if ( Gia_ObjIsBuf(pObj) )
                Jf_ObjPropagateBuf( p, pObj, 0 );
            else if ( Gia_ObjIsAnd(pObj) && Gia_ObjRefNum(p->pGia, pObj) > 0 )
                Vec_IntWriteEntry( &p->vArr, i, Jf_CutArr(p, Jf_ObjCutBest(p, i)) );
    }
    Gia_ManForEachCoDriver( p->pGia, pObj, i )
    {
        assert( Gia_ObjRefNum(p->pGia, pObj) > 0 );
        Delay = Abc_MaxInt( Delay, Jf_ObjArr(p, Gia_ObjId(p->pGia, pObj)) );
    }
    return Delay;
}